

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O1

void __thiscall
highwayhash::HighwayHashCatTest<1U>::operator()
          (HighwayHashCatTest<1U> *this,HHKey *key,char *bytes,uint64_t size,HHResult64 *expected,
          HHNotify notify)

{
  ulong uVar1;
  ulong uVar2;
  int i_1;
  void *pvVar3;
  long lVar4;
  uint64_t *__src;
  uint64_t *__src_00;
  char *pcVar5;
  ulong __n;
  uint64_t *puVar6;
  char *pcVar7;
  HHStateT<1U> *pHVar8;
  HHStatePortable *pHVar9;
  ulong uVar10;
  ulong __n_00;
  size_t i;
  size_t sVar11;
  byte bVar12;
  HHPacket tmp;
  HHStateT<1> state_flat;
  Lanes rotated_keys;
  ulong local_248;
  uint64_t local_220;
  uint64_t uStack_218;
  uint64_t local_210;
  uint64_t uStack_208;
  uint64_t local_200;
  uint64_t uStack_1f8;
  uint64_t local_1f0;
  uint64_t uStack_1e8;
  HHNotify local_1c8;
  HighwayHashCatT<1U> local_1c0;
  HHStatePortable local_100;
  
  bVar12 = 0;
  sVar11 = 0;
  local_1c8 = notify;
  pvVar3 = operator_new__(-(ulong)(size + 1 >> 0x3d != 0) | size * 8 + 8);
  do {
    lVar4 = 0;
    do {
      local_100.v0[lVar4] = (*key)[lVar4] << 0x20 | (*key)[lVar4] >> 0x20;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    local_1c0.state_.v1[2] = 0x13198a2e03707344;
    local_1c0.state_.v1[3] = 0x243f6a8885a308d3;
    local_1c0.state_.v1[0] = 0xdbe6d5d5fe4cce2f;
    local_1c0.state_.v1[1] = 0xa4093822299f31d0;
    local_1c0.state_.mul0[0] = 0x3bd39e10cb0ef593;
    local_1c0.state_.mul0[1] = 0xc0acf169b5f18a8c;
    local_1c0.state_.mul0[2] = 0xbe5466cf34e90c6c;
    local_1c0.state_.mul0[3] = 0x452821e638d01377;
    lVar4 = 0;
    do {
      *(ulong *)(local_1c0.buffer_ + lVar4) =
           *(ulong *)((long)*key + lVar4) ^
           *(ulong *)((long)&Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 + lVar4);
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x20);
    lVar4 = 0;
    do {
      *(ulong *)((long)local_1c0.state_.v0 + lVar4) =
           *(ulong *)((long)local_100.v0 + lVar4) ^
           *(ulong *)((long)&Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 + lVar4);
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x20);
    HighwayHashT<highwayhash::Portable::HHStatePortable,unsigned_long>
              ((HHStatePortable *)&local_1c0,bytes,sVar11,
               (unsigned_long *)((long)pvVar3 + sVar11 * 8));
    sVar11 = sVar11 + 1;
  } while (sVar11 <= size);
  if (2 < size) {
    uVar1 = size / 3;
    __n_00 = 0;
    do {
      __src = (uint64_t *)(bytes + __n_00);
      __n = 0;
      do {
        __src_00 = (uint64_t *)((long)__src + __n);
        local_248 = 0;
        do {
          lVar4 = 0;
          do {
            local_100.v0[lVar4] = (*key)[lVar4] << 0x20 | (*key)[lVar4] >> 0x20;
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          local_1c0.state_.mul0[2] = 0x13198a2e03707344;
          local_1c0.state_.mul0[3] = 0x243f6a8885a308d3;
          local_1c0.state_.mul0[0] = 0xdbe6d5d5fe4cce2f;
          local_1c0.state_.mul0[1] = 0xa4093822299f31d0;
          local_1c0.state_.mul1[0] = 0x3bd39e10cb0ef593;
          local_1c0.state_.mul1[1] = 0xc0acf169b5f18a8c;
          local_1c0.state_.mul1[2] = 0xbe5466cf34e90c6c;
          local_1c0.state_.mul1[3] = 0x452821e638d01377;
          lVar4 = 0;
          do {
            *(ulong *)((long)local_1c0.state_.v0 + lVar4) =
                 *(ulong *)((long)*key + lVar4) ^
                 *(ulong *)((long)&Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 +
                           lVar4);
            lVar4 = lVar4 + 8;
          } while (lVar4 != 0x20);
          lVar4 = 0;
          do {
            *(ulong *)((long)local_1c0.state_.v1 + lVar4) =
                 *(ulong *)((long)local_100.v0 + lVar4) ^
                 *(ulong *)((long)&Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 +
                           lVar4);
            lVar4 = lVar4 + 8;
          } while (lVar4 != 0x20);
          local_1c0.buffer_usage_ = 0;
          local_1c0.buffer_[0] = '\0';
          local_1c0.buffer_[1] = '\0';
          local_1c0.buffer_[2] = '\0';
          local_1c0.buffer_[3] = '\0';
          local_1c0.buffer_[4] = '\0';
          local_1c0.buffer_[5] = '\0';
          local_1c0.buffer_[6] = '\0';
          local_1c0.buffer_[7] = '\0';
          local_1c0.buffer_[8] = '\0';
          local_1c0.buffer_[9] = '\0';
          local_1c0.buffer_[10] = '\0';
          local_1c0.buffer_[0xb] = '\0';
          local_1c0.buffer_[0xc] = '\0';
          local_1c0.buffer_[0xd] = '\0';
          local_1c0.buffer_[0xe] = '\0';
          local_1c0.buffer_[0xf] = '\0';
          local_1c0.buffer_[0x10] = '\0';
          local_1c0.buffer_[0x11] = '\0';
          local_1c0.buffer_[0x12] = '\0';
          local_1c0.buffer_[0x13] = '\0';
          local_1c0.buffer_[0x14] = '\0';
          local_1c0.buffer_[0x15] = '\0';
          local_1c0.buffer_[0x16] = '\0';
          local_1c0.buffer_[0x17] = '\0';
          local_1c0.buffer_[0x18] = '\0';
          local_1c0.buffer_[0x19] = '\0';
          local_1c0.buffer_[0x1a] = '\0';
          local_1c0.buffer_[0x1b] = '\0';
          local_1c0.buffer_[0x1c] = '\0';
          local_1c0.buffer_[0x1d] = '\0';
          local_1c0.buffer_[0x1e] = '\0';
          local_1c0.buffer_[0x1f] = '\0';
          if (__n_00 < 0x20) {
            if (__n_00 != 0) {
              memcpy(&local_1c0,bytes,__n_00);
            }
            local_1c0.buffer_usage_ = local_1c0.buffer_usage_ + __n_00;
          }
          else {
            pHVar8 = &local_1c0.state_;
            pHVar9 = &local_100;
            for (lVar4 = 0x10; puVar6 = (uint64_t *)bytes, uVar10 = __n_00, lVar4 != 0;
                lVar4 = lVar4 + -1) {
              pHVar9->v0[0] = pHVar8->v0[0];
              pHVar8 = (HHStateT<1U> *)((long)pHVar8 + ((ulong)bVar12 * -2 + 1) * 8);
              pHVar9 = (HHStatePortable *)((long)pHVar9 + (ulong)bVar12 * -0x10 + 8);
            }
            do {
              local_220 = *puVar6;
              uStack_218 = puVar6[1];
              local_210 = puVar6[2];
              uStack_208 = puVar6[3];
              Portable::HHStatePortable::Update(&local_100,(Lanes *)&local_220);
              puVar6 = puVar6 + 4;
              uVar10 = uVar10 - 0x20;
            } while (0x1f < uVar10);
            local_1c0.buffer_usage_ = uVar10;
            pHVar9 = &local_100;
            pHVar8 = &local_1c0.state_;
            for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
              pHVar8->v0[0] = pHVar9->v0[0];
              pHVar9 = (HHStatePortable *)((long)pHVar9 + (ulong)bVar12 * -0x10 + 8);
              pHVar8 = (HHStateT<1U> *)((long)pHVar8 + ((ulong)bVar12 * -2 + 1) * 8);
            }
            if (uVar10 != 0) {
              memcpy(&local_1c0,puVar6,uVar10);
            }
          }
          sVar11 = local_1c0.buffer_usage_;
          uVar10 = 0x20 - local_1c0.buffer_usage_;
          if (__n < uVar10) {
            if (__n != 0) {
              memcpy(local_1c0.buffer_ + local_1c0.buffer_usage_,__src,__n);
            }
            local_1c0.buffer_usage_ = local_1c0.buffer_usage_ + __n;
          }
          else {
            pHVar8 = &local_1c0.state_;
            pHVar9 = &local_100;
            for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
              pHVar9->v0[0] = pHVar8->v0[0];
              pHVar8 = (HHStateT<1U> *)((long)pHVar8 + ((ulong)bVar12 * -2 + 1) * 8);
              pHVar9 = (HHStatePortable *)((long)pHVar9 + (ulong)bVar12 * -0x10 + 8);
            }
            puVar6 = __src;
            uVar2 = __n;
            if (local_1c0.buffer_usage_ != 0) {
              memcpy(&local_200,&local_1c0,local_1c0.buffer_usage_);
              if (sVar11 != 0x20) {
                memcpy((void *)((long)&local_200 + sVar11),__src,uVar10);
              }
              local_210 = local_1f0;
              uStack_208 = uStack_1e8;
              local_220 = local_200;
              uStack_218 = uStack_1f8;
              Portable::HHStatePortable::Update(&local_100,(Lanes *)&local_220);
              puVar6 = (uint64_t *)(uVar10 + (long)__src);
              uVar2 = __n - uVar10;
            }
            for (; 0x1f < uVar2; uVar2 = uVar2 - 0x20) {
              local_220 = *puVar6;
              uStack_218 = puVar6[1];
              local_210 = puVar6[2];
              uStack_208 = puVar6[3];
              Portable::HHStatePortable::Update(&local_100,(Lanes *)&local_220);
              puVar6 = puVar6 + 4;
            }
            local_1c0.buffer_usage_ = uVar2;
            pHVar9 = &local_100;
            pHVar8 = &local_1c0.state_;
            for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
              pHVar8->v0[0] = pHVar9->v0[0];
              pHVar9 = (HHStatePortable *)((long)pHVar9 + (ulong)bVar12 * -0x10 + 8);
              pHVar8 = (HHStateT<1U> *)((long)pHVar8 + ((ulong)bVar12 * -2 + 1) * 8);
            }
            if (uVar2 != 0) {
              memcpy(&local_1c0,puVar6,uVar2);
            }
          }
          sVar11 = local_1c0.buffer_usage_;
          uVar10 = 0x20 - local_1c0.buffer_usage_;
          if (local_248 < uVar10) {
            if (local_248 != 0) {
              memcpy(local_1c0.buffer_ + local_1c0.buffer_usage_,__src_00,local_248);
            }
            local_1c0.buffer_usage_ = local_1c0.buffer_usage_ + local_248;
          }
          else {
            pHVar8 = &local_1c0.state_;
            pHVar9 = &local_100;
            for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
              pHVar9->v0[0] = pHVar8->v0[0];
              pHVar8 = (HHStateT<1U> *)((long)pHVar8 + ((ulong)bVar12 * -2 + 1) * 8);
              pHVar9 = (HHStatePortable *)((long)pHVar9 + (ulong)bVar12 * -0x10 + 8);
            }
            puVar6 = __src_00;
            uVar2 = local_248;
            if (local_1c0.buffer_usage_ != 0) {
              memcpy(&local_200,&local_1c0,local_1c0.buffer_usage_);
              if (sVar11 != 0x20) {
                memcpy((void *)((long)&local_200 + sVar11),__src_00,uVar10);
              }
              local_210 = local_1f0;
              uStack_208 = uStack_1e8;
              local_220 = local_200;
              uStack_218 = uStack_1f8;
              Portable::HHStatePortable::Update(&local_100,(Lanes *)&local_220);
              puVar6 = (uint64_t *)(uVar10 + (long)__src_00);
              uVar2 = local_248 - uVar10;
            }
            for (; 0x1f < uVar2; uVar2 = uVar2 - 0x20) {
              local_220 = *puVar6;
              uStack_218 = puVar6[1];
              local_210 = puVar6[2];
              uStack_208 = puVar6[3];
              Portable::HHStatePortable::Update(&local_100,(Lanes *)&local_220);
              puVar6 = puVar6 + 4;
            }
            local_1c0.buffer_usage_ = uVar2;
            pHVar9 = &local_100;
            pHVar8 = &local_1c0.state_;
            for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
              pHVar8->v0[0] = pHVar9->v0[0];
              pHVar9 = (HHStatePortable *)((long)pHVar9 + (ulong)bVar12 * -0x10 + 8);
              pHVar8 = (HHStateT<1U> *)((long)pHVar8 + ((ulong)bVar12 * -2 + 1) * 8);
            }
            if (uVar2 != 0) {
              memcpy(&local_1c0,puVar6,uVar2);
            }
          }
          HighwayHashCatT<1U>::Finalize<unsigned_long>(&local_1c0,local_100.v0);
          pcVar7 = (char *)((long)__src_00 + (local_248 - (long)bytes));
          if (*(uint64_t *)((long)pvVar3 + (long)pcVar7 * 8) != local_100.v0[0]) {
            pcVar5 = TargetName(1);
            (*local_1c8)(pcVar5,(size_t)pcVar7);
          }
          local_248 = local_248 + 1;
        } while (local_248 != uVar1);
        __n = __n + 1;
      } while (__n != uVar1);
      __n_00 = __n_00 + 1;
    } while (__n_00 != uVar1);
  }
  operator_delete__(pvVar3);
  return;
}

Assistant:

void HighwayHashCatTest<Target>::operator()(const HHKey& key,
                                            const char* HH_RESTRICT bytes,
                                            const uint64_t size,
                                            const HHResult64* expected,
                                            const HHNotify notify) const {
  TestHighwayHashCat(key, bytes, size, expected, notify);
}